

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

void __thiscall
cmCTestTestHandler::ProcessDirectory
          (cmCTestTestHandler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *passed,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *failed)

{
  int *__k;
  cmCTest *pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  size_t __n;
  pointer pcVar4;
  pointer pcVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  cmCTestMultiProcessHandler *this_00;
  ostream *poVar9;
  time_t tVar10;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *this_01;
  mapped_type *ppcVar11;
  mapped_type pcVar12;
  iterator i;
  pointer pbVar13;
  pointer pcVar14;
  pointer this_02;
  pointer pbVar15;
  double dVar16;
  TestSet depends;
  TestMap tests;
  PropertiesMap properties;
  undefined1 local_e8 [32];
  _Base_ptr local_c8;
  size_t local_c0;
  mapped_type local_b8;
  undefined1 local_b0 [32];
  _Base_ptr local_90;
  size_t local_88;
  double local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_70;
  cmCTestMultiProcessHandler *local_68;
  _Rb_tree<int,_std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>,_std::_Select1st<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
  local_60;
  
  local_78 = passed;
  local_70 = failed;
  ComputeTestList(this);
  cmCTest::CurrentTime_abi_cxx11_((string *)local_b0,(this->super_cmCTestGenericHandler).CTest);
  std::__cxx11::string::operator=((string *)&this->StartTest,(string *)local_b0);
  if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  dVar16 = cmsys::SystemTools::GetTime();
  this->StartTestTime = (uint)(long)dVar16;
  local_80 = cmsys::SystemTools::GetTime();
  if (((this->super_cmCTestGenericHandler).CTest)->BatchJobs == true) {
    this_00 = (cmCTestMultiProcessHandler *)operator_new(0x200);
    cmCTestMultiProcessHandler::cmCTestMultiProcessHandler(this_00);
    this_00->_vptr_cmCTestMultiProcessHandler = (_func_int **)&PTR__cmCTestBatchTestHandler_006b73e0
    ;
    this_00[1]._vptr_cmCTestMultiProcessHandler =
         (_func_int **)
         &this_00[1].Tests.
          super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
          ._M_t._M_impl.super__Rb_tree_header;
    *(undefined8 *)
     &this_00[1].Tests.
      super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
      ._M_t._M_impl = 0;
    *(undefined1 *)
     &this_00[1].Tests.
      super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  }
  else {
    this_00 = (cmCTestMultiProcessHandler *)operator_new(0x1e0);
    cmCTestMultiProcessHandler::cmCTestMultiProcessHandler(this_00);
  }
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  this_00->CTest = pcVar1;
  cmCTestMultiProcessHandler::SetParallelLevel(this_00,(long)pcVar1->ParallelLevel);
  this_00->TestHandler = this;
  this_00->Quiet = (this->super_cmCTestGenericHandler).Quiet;
  poVar9 = this->LogFile;
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Start testing: ",0xf);
  cmCTest::CurrentTime_abi_cxx11_((string *)local_b0,(this->super_cmCTestGenericHandler).CTest);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(char *)local_b0._0_8_,CONCAT44(local_b0._12_4_,local_b0._8_4_));
  std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
  std::ostream::put((char)poVar9);
  poVar9 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,"----------------------------------------------------------",0x3a);
  std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
    operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
  }
  local_b0._24_8_ = local_b0 + 8;
  local_b0._8_4_ = _S_red;
  local_b0._16_8_ = 0;
  local_88 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  pcVar2 = (pcVar1->ScheduleType)._M_dataplus._M_p;
  local_e8._0_8_ = local_e8 + 0x10;
  local_90 = (_Base_ptr)local_b0._24_8_;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_e8,pcVar2,pcVar2 + (pcVar1->ScheduleType)._M_string_length);
  iVar7 = std::__cxx11::string::compare(local_e8);
  if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
    operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
  }
  if (iVar7 == 0) {
    tVar10 = time((time_t *)0x0);
    srand((uint)tVar10);
  }
  pcVar12 = (this->TestList).
            super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pcVar12 !=
      (this->TestList).
      super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_68 = this_00;
      local_e8._8_4_ = _S_red;
      local_e8._16_8_ = (_Base_ptr)0x0;
      local_e8._24_8_ = local_e8 + 8;
      local_c0 = 0;
      local_c8 = (_Base_ptr)local_e8._24_8_;
      if (iVar7 == 0) {
        iVar8 = rand();
        pcVar12->Cost = (float)iVar8;
      }
      if ((pcVar12->Timeout == 0.0) && (!NAN(pcVar12->Timeout))) {
        dVar16 = ((this->super_cmCTestGenericHandler).CTest)->GlobalTimeout;
        if ((dVar16 != 0.0) || (NAN(dVar16))) {
          pcVar12->Timeout = dVar16;
        }
      }
      pbVar15 = (pcVar12->Depends).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      local_b8 = pcVar12;
      for (pbVar13 = (pcVar12->Depends).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pcVar12 = local_b8,
          pbVar13 != pbVar15; pbVar13 = pbVar13 + 1) {
        pcVar14 = (this->TestList).
                  super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pcVar3 = (this->TestList).
                 super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pcVar14 != pcVar3) {
          __n = pbVar13->_M_string_length;
          do {
            if (((pcVar14->Name)._M_string_length == __n) &&
               ((__n == 0 ||
                (iVar8 = bcmp((pcVar14->Name)._M_dataplus._M_p,(pbVar13->_M_dataplus)._M_p,__n),
                iVar8 == 0)))) {
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )local_e8,&pcVar14->Index);
              pbVar15 = (local_b8->Depends).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              break;
            }
            pcVar14 = pcVar14 + 1;
          } while (pcVar14 != pcVar3);
        }
      }
      __k = &local_b8->Index;
      this_01 = (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                std::
                map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                ::operator[]((map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                              *)local_b0,__k);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::operator=
                (this_01,(_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                          *)local_e8);
      ppcVar11 = std::
                 map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                 ::operator[]((map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                               *)&local_60,__k);
      *ppcVar11 = pcVar12;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 local_e8);
      pcVar12 = pcVar12 + 1;
      this_00 = local_68;
    } while (pcVar12 !=
             (this->TestList).
             super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  cmCTestMultiProcessHandler::SetTests(this_00,(TestMap *)local_b0,(PropertiesMap *)&local_60);
  this_00->Passed = local_78;
  this_00->Failed = local_70;
  pcVar4 = (this->TestResults).
           super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar5 = (this->TestResults).
           super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_02 = pcVar4;
  if (pcVar5 != pcVar4) {
    do {
      cmCTestTestResult::~cmCTestTestResult(this_02);
      this_02 = this_02 + 1;
    } while (this_02 != pcVar5);
    (this->TestResults).
    super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
    ._M_impl.super__Vector_impl_data._M_finish = pcVar4;
  }
  this_00->TestResults = &this->TestResults;
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  if (pcVar1->PrintLabels == true) {
    cmCTestMultiProcessHandler::PrintLabels(this_00);
  }
  else {
    bVar6 = cmCTest::GetShowOnly(pcVar1);
    if (bVar6) {
      cmCTestMultiProcessHandler::PrintTestList(this_00);
    }
    else {
      (*this_00->_vptr_cmCTestMultiProcessHandler[2])(this_00);
    }
  }
  (*this_00->_vptr_cmCTestMultiProcessHandler[1])(this_00);
  cmCTest::CurrentTime_abi_cxx11_((string *)local_e8,(this->super_cmCTestGenericHandler).CTest);
  std::__cxx11::string::operator=((string *)&this->EndTest,(string *)local_e8);
  if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
    operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
  }
  dVar16 = cmsys::SystemTools::GetTime();
  this->EndTestTime = (uint)(long)dVar16;
  dVar16 = cmsys::SystemTools::GetTime();
  this->ElapsedTestingTime = dVar16 - local_80;
  poVar9 = this->LogFile;
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"End testing: ",0xd);
  cmCTest::CurrentTime_abi_cxx11_((string *)local_e8,(this->super_cmCTestGenericHandler).CTest);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(char *)local_e8._0_8_,CONCAT44(local_e8._12_4_,local_e8._8_4_));
  std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
    operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>,_std::_Select1st<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<int,_std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>,_std::_Select1st<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>,_std::_Select1st<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
               *)local_b0);
  return;
}

Assistant:

void cmCTestTestHandler::ProcessDirectory(std::vector<std::string> &passed,
                                         std::vector<std::string> &failed)
{
  this->ComputeTestList();
  this->StartTest = this->CTest->CurrentTime();
  this->StartTestTime = static_cast<unsigned int>(cmSystemTools::GetTime());
  double elapsed_time_start = cmSystemTools::GetTime();

  cmCTestMultiProcessHandler* parallel = this->CTest->GetBatchJobs() ?
    new cmCTestBatchTestHandler : new cmCTestMultiProcessHandler;
  parallel->SetCTest(this->CTest);
  parallel->SetParallelLevel(this->CTest->GetParallelLevel());
  parallel->SetTestHandler(this);
  parallel->SetQuiet(this->Quiet);

  *this->LogFile << "Start testing: "
    << this->CTest->CurrentTime() << std::endl
    << "----------------------------------------------------------"
    << std::endl;

  cmCTestMultiProcessHandler::TestMap tests;
  cmCTestMultiProcessHandler::PropertiesMap properties;

  bool randomSchedule = this->CTest->GetScheduleType() == "Random";
  if(randomSchedule)
    {
    srand((unsigned)time(0));
    }

  for (ListOfTests::iterator it = this->TestList.begin();
       it != this->TestList.end(); ++it)
    {
    cmCTestTestProperties& p = *it;
    cmCTestMultiProcessHandler::TestSet depends;

    if(randomSchedule)
      {
      p.Cost = static_cast<float>(rand());
      }

    if(p.Timeout == 0 && this->CTest->GetGlobalTimeout() != 0)
      {
      p.Timeout = this->CTest->GetGlobalTimeout();
      }

    if(!p.Depends.empty())
      {
      for(std::vector<std::string>::iterator i = p.Depends.begin();
          i != p.Depends.end(); ++i)
        {
        for(ListOfTests::iterator it2 = this->TestList.begin();
            it2 != this->TestList.end(); ++it2)
          {
          if(it2->Name == *i)
            {
            depends.insert(it2->Index);
            break; // break out of test loop as name can only match 1
            }
          }
        }
      }
    tests[it->Index] = depends;
    properties[it->Index] = &*it;
    }
  parallel->SetTests(tests, properties);
  parallel->SetPassFailVectors(&passed, &failed);
  this->TestResults.clear();
  parallel->SetTestResults(&this->TestResults);

  if(this->CTest->ShouldPrintLabels())
    {
    parallel->PrintLabels();
    }
  else if(this->CTest->GetShowOnly())
    {
    parallel->PrintTestList();
    }
  else
    {
    parallel->RunTests();
    }
  delete parallel;
  this->EndTest = this->CTest->CurrentTime();
  this->EndTestTime = static_cast<unsigned int>(cmSystemTools::GetTime());
  this->ElapsedTestingTime = cmSystemTools::GetTime() - elapsed_time_start;
  *this->LogFile << "End testing: "
     << this->CTest->CurrentTime() << std::endl;
}